

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_to_hex_or_txid(wally_tx *tx,uint32_t flags,char **output,uchar *bytes_out,size_t len,
                     _Bool is_elements)

{
  uchar *dest;
  int iVar1;
  int iVar2;
  size_t n;
  size_t written;
  uchar buff [2048];
  ulong local_860;
  uchar *local_858;
  uchar *local_850;
  size_t local_848;
  size_t local_840;
  uchar local_838 [2056];
  
  if (output == (char **)0x0) {
    if (len != 0x20 || bytes_out == (uchar *)0x0) {
      return -2;
    }
  }
  else {
    *output = (char *)0x0;
    if (bytes_out != (uchar *)0x0 || len != 0) {
      return -2;
    }
  }
  local_850 = bytes_out;
  local_848 = len;
  iVar1 = tx_to_bytes(tx,(tx_serialize_opts *)0x0,flags,local_838,0x800,&local_860,is_elements);
  if (iVar1 == 0) {
    local_858 = local_838;
    iVar1 = 0;
    if (0x800 < local_860) {
      local_858 = (uchar *)wally_malloc(local_860);
      if (local_858 == (uchar *)0x0) {
        return -3;
      }
      iVar2 = tx_to_bytes(tx,(tx_serialize_opts *)0x0,flags,local_858,local_860,&local_840,
                          is_elements);
      iVar1 = -1;
      if (local_860 == local_840) {
        iVar1 = iVar2;
      }
    }
    dest = local_858;
    if (iVar1 == 0) {
      if (output == (char **)0x0) {
        iVar1 = wally_sha256d(local_858,local_860,local_850,local_848);
      }
      else {
        iVar1 = wally_hex_from_bytes(local_858,local_860,output);
      }
    }
    wally_clear(dest,local_860);
    if (dest != local_838) {
      wally_free(dest);
    }
  }
  return iVar1;
}

Assistant:

static int tx_to_hex_or_txid(const struct wally_tx *tx, uint32_t flags,
                             char **output,
                             unsigned char *bytes_out, size_t len,
                             bool is_elements)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t n, written;
    int ret;

    if (output)
        *output = NULL;

    if ((output && (bytes_out || len)) ||
        (!output && (!bytes_out || len != WALLY_TXHASH_LEN)))
        return WALLY_EINVAL;

    ret = tx_to_bytes(tx, NULL, flags, buff_p, sizeof(buff), &n, is_elements);
    if (ret == WALLY_OK) {
        if (n > sizeof(buff)) {
            if ((buff_p = wally_malloc(n)) == NULL)
                return WALLY_ENOMEM;
            ret = tx_to_bytes(tx, NULL, flags, buff_p, n, &written, is_elements);
            if (n != written)
                ret = WALLY_ERROR; /* Length calculated incorrectly */
        }
        if (ret == WALLY_OK) {
            if (output)
                ret = wally_hex_from_bytes(buff_p, n, output);
            else
                ret = wally_sha256d(buff_p, n, bytes_out, len);
        }
        wally_clear(buff_p, n);
        if (buff_p != buff)
            wally_free(buff_p);
    }
    return ret;
}